

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance_array.cpp
# Opt level: O3

void __thiscall
embree::InstanceArray::setInstancedScenes(InstanceArray *this,RTCScene *scenes,size_t numScenes)

{
  Device *pDVar1;
  RTCScene pRVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  Accel **ppAVar5;
  ulong uVar6;
  
  ppAVar5 = this->objects;
  if (ppAVar5 != (Accel **)0x0) {
    uVar3 = this->numObjects;
    if (uVar3 != 0) {
      uVar6 = 0;
      do {
        if (this->objects[uVar6] != (Accel *)0x0) {
          (*(this->objects[uVar6]->super_AccelData).super_RefCount._vptr_RefCount[3])();
          uVar3 = this->numObjects;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar3);
      ppAVar5 = this->objects;
    }
    pDVar1 = (this->super_Geometry).device;
    (*(pDVar1->super_State).super_RefCount._vptr_RefCount[9])(pDVar1,ppAVar5);
    pDVar1 = (this->super_Geometry).device;
    (*(pDVar1->super_State).super_RefCount._vptr_RefCount[4])(pDVar1,(ulong)this->numObjects * -8,1)
    ;
  }
  this->numObjects = (uint32_t)numScenes;
  pDVar1 = (this->super_Geometry).device;
  (*(pDVar1->super_State).super_RefCount._vptr_RefCount[4])(pDVar1,numScenes << 3 & 0x7fffffff8,0);
  pDVar1 = (this->super_Geometry).device;
  iVar4 = (*(pDVar1->super_State).super_RefCount._vptr_RefCount[8])(pDVar1,numScenes << 3,0x10,3);
  this->objects = (Accel **)CONCAT44(extraout_var,iVar4);
  if (this->numObjects != 0) {
    uVar6 = 0;
    do {
      pRVar2 = scenes[uVar6];
      if (pRVar2 != (RTCScene)0x0) {
        (**(code **)(*(long *)pRVar2 + 0x10))(pRVar2);
      }
      this->objects[uVar6] = (Accel *)pRVar2;
      if (this->objects[uVar6] != (Accel *)0x0) {
        (*(this->objects[uVar6]->super_AccelData).super_RefCount._vptr_RefCount[2])();
      }
      if (pRVar2 != (RTCScene)0x0) {
        (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < this->numObjects);
  }
  Geometry::update(&this->super_Geometry);
  return;
}

Assistant:

void InstanceArray::setInstancedScenes(const RTCScene* scenes, size_t numScenes) {
    if (objects) {
      for (size_t i = 0; i < numObjects; ++i) {
        if (objects[i]) objects[i]->refDec();
      }
      device->free(objects);
      device->memoryMonitor(-ssize_t(numObjects*sizeof(Accel*)), true);
    }

    numObjects = numScenes;
    device->memoryMonitor(numObjects*sizeof(Accel*), false);
    objects = (Accel**) device->malloc(numScenes*sizeof(Accel*),16,EmbreeMemoryType::MALLOC);
    for (size_t i = 0; i < numObjects; ++i) {
      Ref<Scene> scene = (Scene*) scenes[i];
      objects[i] = scene.ptr;
      if (objects[i]) objects[i]->refInc();
    }
    Geometry::update();
  }